

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglGLES2SharingTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::GLES2TextureSharingTest::renderResource
          (GLES2TextureSharingTest *this,Surface *screen,Surface *reference)

{
  GLsizei GVar1;
  GLsizei GVar2;
  glReadPixelsFunc p_Var3;
  uint uVar4;
  GLenum GVar5;
  GLuint GVar6;
  GLuint GVar7;
  GLint GVar8;
  TestError *pTVar9;
  uint uVar10;
  int y;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  uint uVar17;
  uint uVar18;
  uint uVar19;
  allocator<char> local_232;
  allocator<char> local_231;
  float local_230;
  int local_22c;
  float local_228;
  float local_224;
  Surface *local_220;
  Vec4 color;
  string local_1f8;
  ProgramSources local_1d8;
  ShaderProgram program;
  
  local_220 = reference;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&color,
             "attribute mediump vec2 a_pos;\nattribute mediump vec2 a_texCorod;\nvarying mediump vec2 v_texCoord;\nvoid main(void)\n{\n\tv_texCoord = a_texCorod;\n\tgl_Position = vec4(a_pos, 0.0, 1.0);\n}\n"
             ,&local_231);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1f8,
             "varying mediump vec2 v_texCoord;\nuniform sampler2D u_sampler;\nvoid main(void)\n{\n\tgl_FragColor = texture2D(u_sampler, v_texCoord);\n}\n"
             ,&local_232);
  glu::makeVtxFragSources(&local_1d8,(string *)&color,&local_1f8);
  glu::ShaderProgram::ShaderProgram(&program,&(this->super_GLES2SharingTest).m_gl,&local_1d8);
  glu::ProgramSources::~ProgramSources(&local_1d8);
  std::__cxx11::string::~string((string *)&local_1f8);
  std::__cxx11::string::~string((string *)&color);
  if (program.m_program.m_info.linkOk == false) {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,"Failed to compile shader program",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x219);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  if (screen == (Surface *)0x0) {
    iVar12 = 0xf0;
    iVar11 = 0xf0;
  }
  else {
    iVar11 = screen->m_width;
    iVar12 = screen->m_height;
  }
  (*(this->super_GLES2SharingTest).m_gl.viewport)(0,0,iVar11,iVar12);
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"viewport(0, 0, width, height)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x237);
  (*(this->super_GLES2SharingTest).m_gl.clearColor)(1.0,0.0,0.0,1.0);
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"clearColor(1.0f, 0.0f, 0.0f, 1.0f)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x239);
  (*(this->super_GLES2SharingTest).m_gl.clear)(0x4000);
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"clear(GL_COLOR_BUFFER_BIT)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x23a);
  (*(this->super_GLES2SharingTest).m_gl.useProgram)(program.m_program.m_program);
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"useProgram(program.getProgram())",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x23c);
  GVar6 = (*(this->super_GLES2SharingTest).m_gl.getAttribLocation)
                    (program.m_program.m_program,"a_pos");
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"glGetAttribLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x23f);
  if (GVar6 == 0xffffffff) {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,(char *)0x0,"coordLocation != (GLuint)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x240);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  GVar7 = (*(this->super_GLES2SharingTest).m_gl.getAttribLocation)
                    (program.m_program.m_program,"a_texCorod");
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"glGetAttribLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x243);
  if (GVar7 == 0xffffffff) {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,(char *)0x0,"texCoordLocation != (GLuint)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x244);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  GVar8 = (*(this->super_GLES2SharingTest).m_gl.getUniformLocation)
                    (program.m_program.m_program,"u_sampler");
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"glGetUniformLocation()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x248);
  if (GVar8 == -1) {
    pTVar9 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar9,(char *)0x0,"samplerLocation != (GLuint)-1",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
               ,0x249);
    __cxa_throw(pTVar9,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  (*(this->super_GLES2SharingTest).m_gl.activeTexture)(0x84c0);
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"activeTexture(GL_TEXTURE0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x24b);
  (*(this->super_GLES2SharingTest).m_gl.bindTexture)(0xde1,this->m_glTexture);
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"bindTexture(GL_TEXTURE_2D, m_glTexture)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x24c);
  (*(this->super_GLES2SharingTest).m_gl.uniform1i)(GVar8,0);
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"uniform1i(samplerLocation, 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x24e);
  (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(GVar7);
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"enableVertexAttribArray(texCoordLocation)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x250);
  (*(this->super_GLES2SharingTest).m_gl.enableVertexAttribArray)(GVar6);
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"enableVertexAttribArray(coordLocation)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x251);
  (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
            (GVar7,2,0x1406,'\0',0,renderResource::texCoords);
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"vertexAttribPointer(texCoordLocation, 2, GL_FLOAT, GL_FALSE, 0, texCoords)"
                  ,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x253);
  (*(this->super_GLES2SharingTest).m_gl.vertexAttribPointer)
            (GVar6,2,0x1406,'\0',0,renderResource::coords);
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"vertexAttribPointer(coordLocation, 2, GL_FLOAT, GL_FALSE, 0, coords)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x254);
  (*(this->super_GLES2SharingTest).m_gl.drawElements)(4,6,0x1403,renderResource::indices);
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, indices)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x256);
  (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(GVar6);
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"disableVertexAttribArray(coordLocation)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,599);
  (*(this->super_GLES2SharingTest).m_gl.disableVertexAttribArray)(GVar7);
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"disableVertexAttribArray(texCoordLocation)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,600);
  (*(this->super_GLES2SharingTest).m_gl.bindTexture)(0xde1,0);
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"bindTexture(GL_TEXTURE_2D, 0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x25a);
  (*(this->super_GLES2SharingTest).m_gl.useProgram)(0);
  GVar5 = (*(this->super_GLES2SharingTest).m_gl.getError)();
  glu::checkError(GVar5,"useProgram(0)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglGLES2SharingTests.cpp"
                  ,0x25b);
  if (screen != (Surface *)0x0) {
    p_Var3 = (this->super_GLES2SharingTest).m_gl.readPixels;
    GVar1 = screen->m_width;
    GVar2 = screen->m_height;
    tcu::Surface::getAccess((PixelBufferAccess *)&local_1d8,screen);
    iVar13 = 0;
    (*p_Var3)(0,0,GVar1,GVar2,0x1908,0x1401,
              (void *)CONCAT44(local_1d8.sources[1].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish._4_4_,
                               local_1d8.sources[1].
                               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_finish._0_4_));
    local_228 = (float)iVar12 + -1.0;
    if (iVar12 < 1) {
      iVar12 = 0;
    }
    local_230 = (float)iVar11 + -1.0;
    local_22c = iVar11;
    if (iVar11 < 1) {
      local_22c = 0;
    }
    for (; iVar13 != local_22c; iVar13 = iVar13 + 1) {
      local_224 = (float)iVar13 / local_230;
      for (iVar11 = 0; iVar12 != iVar11; iVar11 = iVar11 + 1) {
        local_1d8.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x200000002;
        local_1d8.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x100000002;
        local_1d8.sources[0].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&DAT_00000001;
        local_1d8.sources[1].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._0_1_ = 1;
        local_1d8.sources[2].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
        local_1d8.sources[1].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._4_1_ = 0;
        local_1d8.sources._45_8_ = 0;
        local_1d8.sources[1].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start._4_4_ = 0;
        local_1d8.sources[1].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._0_4_ = 0;
        local_1d8.sources[1].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish._4_4_ = 0;
        local_1d8.sources[1].
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
        tcu::Texture2DView::sample
                  ((Texture2DView *)&color,(Sampler *)&(this->m_texture).m_view,local_224,
                   (float)iVar11 / local_228,0.0);
        uVar14 = (uint)(color.m_data[0] * 255.0);
        uVar15 = (uint)(color.m_data[1] * 255.0);
        uVar16 = (uint)(color.m_data[2] * 255.0);
        uVar17 = (uint)(color.m_data[3] * 255.0);
        uVar4 = uVar14;
        if (0xfe < uVar14) {
          uVar4 = 0xff;
        }
        uVar10 = uVar15;
        if (0xfe < uVar15) {
          uVar10 = 0xff;
        }
        uVar18 = -(uint)(-0x7fffff02 < (int)(uVar16 ^ 0x80000000));
        uVar19 = -(uint)(-0x7fffff02 < (int)(uVar17 ^ 0x80000000));
        *(uint *)((long)(local_220->m_pixels).m_ptr +
                 (long)(local_220->m_width * iVar11 + iVar13) * 4) =
             ~((int)uVar17 >> 0x1f) & (uVar19 >> 0x18 | ~uVar19 & uVar17) << 0x18 |
             ~((int)uVar15 >> 0x1f) & uVar10 << 8 |
             ~((int)uVar16 >> 0x1f) & (uVar18 >> 0x18 | ~uVar18 & uVar16) << 0x10 |
             ~((int)uVar14 >> 0x1f) & uVar4;
      }
    }
  }
  glu::ShaderProgram::~ShaderProgram(&program);
  return;
}

Assistant:

void GLES2TextureSharingTest::renderResource (tcu::Surface* screen, tcu::Surface* reference)
{
	DE_ASSERT((screen && reference) || (!screen && !reference));

	const char* vertexShader = ""
	"attribute mediump vec2 a_pos;\n"
	"attribute mediump vec2 a_texCorod;\n"
	"varying mediump vec2 v_texCoord;\n"
	"void main(void)\n"
	"{\n"
	"\tv_texCoord = a_texCorod;\n"
	"\tgl_Position = vec4(a_pos, 0.0, 1.0);\n"
	"}\n";

	const char* fragmentShader = ""
	"varying mediump vec2 v_texCoord;\n"
	"uniform sampler2D u_sampler;\n"
	"void main(void)\n"
	"{\n"
	"\tgl_FragColor = texture2D(u_sampler, v_texCoord);\n"
	"}\n";

	glu::ShaderProgram program(m_gl, glu::makeVtxFragSources(vertexShader, fragmentShader));

	if (!program.isOk())
		TCU_FAIL("Failed to compile shader program");

	int width = 240;
	int height = 240;

	if (screen)
	{
		width = screen->getWidth();
		height = screen->getHeight();
	}

	static const GLfloat coords[] = {
		-1.0f, -1.0f,
		 1.0f, -1.0f,
		 1.0f,  1.0f,
		-1.0f,  1.0f
	};

	static const GLfloat texCoords[] = {
		0.0f, 0.0f,
		1.0f, 0.0f,
		1.0f, 1.0f,
		0.0f, 1.0f
	};

	static const GLushort indices[] = {
		0, 1, 2,
		2, 3, 0
	};

	GLU_CHECK_GLW_CALL(m_gl, viewport(0, 0, width, height));

	GLU_CHECK_GLW_CALL(m_gl, clearColor(1.0f, 0.0f, 0.0f, 1.0f));
	GLU_CHECK_GLW_CALL(m_gl, clear(GL_COLOR_BUFFER_BIT));

	GLU_CHECK_GLW_CALL(m_gl, useProgram(program.getProgram()));

	GLuint coordLocation = m_gl.getAttribLocation(program.getProgram(), "a_pos");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(coordLocation != (GLuint)-1);

	GLuint texCoordLocation = m_gl.getAttribLocation(program.getProgram(), "a_texCorod");
	GLU_CHECK_GLW_MSG(m_gl, "glGetAttribLocation()");
	TCU_CHECK(texCoordLocation != (GLuint)-1);


	GLuint samplerLocation = m_gl.getUniformLocation(program.getProgram(), "u_sampler");
	GLU_CHECK_GLW_MSG(m_gl, "glGetUniformLocation()");
	TCU_CHECK(samplerLocation != (GLuint)-1);

	GLU_CHECK_GLW_CALL(m_gl, activeTexture(GL_TEXTURE0));
	GLU_CHECK_GLW_CALL(m_gl, bindTexture(GL_TEXTURE_2D, m_glTexture));

	GLU_CHECK_GLW_CALL(m_gl, uniform1i(samplerLocation, 0));

	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(texCoordLocation));
	GLU_CHECK_GLW_CALL(m_gl, enableVertexAttribArray(coordLocation));

	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(texCoordLocation, 2, GL_FLOAT, GL_FALSE, 0, texCoords));
	GLU_CHECK_GLW_CALL(m_gl, vertexAttribPointer(coordLocation, 2, GL_FLOAT, GL_FALSE, 0, coords));

	GLU_CHECK_GLW_CALL(m_gl, drawElements(GL_TRIANGLES, 6, GL_UNSIGNED_SHORT, indices));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(coordLocation));
	GLU_CHECK_GLW_CALL(m_gl, disableVertexAttribArray(texCoordLocation));

	GLU_CHECK_GLW_CALL(m_gl, bindTexture(GL_TEXTURE_2D, 0));
	GLU_CHECK_GLW_CALL(m_gl, useProgram(0));

	if (screen)
	{
		m_gl.readPixels(0, 0, screen->getWidth(), screen->getHeight(), GL_RGBA, GL_UNSIGNED_BYTE, screen->getAccess().getDataPtr());

		for (int x = 0; x < width; x++)
		{
			for (int y = 0; y < height; y++)
			{
				float t = ((float)x / ((float)width - 1.0f));
				float s = ((float)y / ((float)height - 1.0f));
				float lod = 0.0f;

				tcu::Vec4 color = m_texture.sample(tcu::Sampler(tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL, tcu::Sampler::REPEAT_GL, tcu::Sampler::LINEAR, tcu::Sampler::LINEAR), t, s, lod);

				int r = deClamp32((int)(255.0f * color.x()), 0, 255);
				int g = deClamp32((int)(255.0f * color.y()), 0, 255);
				int b = deClamp32((int)(255.0f * color.z()), 0, 255);
				int a = deClamp32((int)(255.0f * color.w()), 0, 255);

				reference->setPixel(x, y, tcu::RGBA(r, g, b, a));
			}
		}
	}
}